

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

void __thiscall
vsencoding::VSEncodingBlocks::encodeVS
          (VSEncodingBlocks *this,uint32_t len,uint32_t *in,uint32_t *size,uint32_t *out)

{
  undefined4 *puVar1;
  bool bVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  uint32_t *seq;
  ulong uVar9;
  uint32_t *puVar10;
  long *plVar11;
  long lVar12;
  void *pvVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  int *piVar20;
  ushort uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  uint32_t numBlocks;
  uint32_t countBlocksLogs [16];
  uint32_t blockCur [16];
  uint32_t *blocks [16];
  uint local_144;
  uint32_t *local_140;
  uint local_138;
  undefined1 auStack_134 [60];
  uint local_f8;
  undefined1 auStack_f4 [60];
  long local_b8 [17];
  
  local_140 = size;
  seq = (uint32_t *)operator_new__((ulong)len * 4);
  if (len != 0) {
    uVar9 = 0;
    do {
      uVar17 = in[uVar9];
      if (uVar17 == 0) {
        uVar18 = 1;
      }
      else {
        iVar3 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar18 = (ulong)(iVar3 + 2);
      }
      seq[uVar9] = *(uint32_t *)(__vseblocks_remapLogs + uVar18 * 4);
      uVar9 = uVar9 + 1;
    } while (len != uVar9);
  }
  puVar10 = VSEncoding::compute_OptPartition(__vseblocks,seq,len,8,&local_144);
  plVar11 = (long *)operator_new(0x20);
  *plVar11 = (long)out;
  *(undefined4 *)(plVar11 + 1) = 0;
  plVar11[2] = 0;
  *(undefined4 *)(plVar11 + 3) = 0;
  auVar24 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_138 = auVar24._0_4_;
  auStack_134 = auVar24._4_60_;
  auVar24 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_f8 = auVar24._0_4_;
  auStack_f4 = auVar24._4_60_;
  if ((ulong)local_144 != 0) {
    uVar9 = 0;
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      uVar17 = puVar10[uVar9];
      uVar14 = puVar10[uVar9 + 1];
      if (uVar17 < uVar14) {
        uVar18 = ((ulong)uVar14 - (ulong)uVar17) + 0xf & 0xfffffffffffffff0;
        auVar26 = vpbroadcastq_avx512f();
        auVar33 = ZEXT1664((undefined1  [16])0x0);
        uVar19 = 0;
        do {
          auVar27 = vmovdqa64_avx512f(auVar33);
          auVar33 = vpbroadcastq_avx512f();
          auVar28 = vporq_avx512f(auVar33,auVar24);
          auVar33 = vporq_avx512f(auVar33,auVar25);
          uVar5 = vpcmpuq_avx512f(auVar33,auVar26,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar28,auVar26,2);
          bVar7 = (byte)uVar5;
          uVar21 = CONCAT11(bVar7,bVar6);
          auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])(seq + uVar17 + uVar19));
          auVar28._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar33._4_4_;
          auVar28._0_4_ = (uint)(bVar6 & 1) * auVar33._0_4_;
          auVar28._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar33._8_4_;
          auVar28._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar33._12_4_;
          auVar28._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar33._16_4_;
          auVar28._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar33._20_4_;
          auVar28._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar33._24_4_;
          auVar28._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar33._28_4_;
          auVar28._32_4_ = (uint)(bVar7 & 1) * auVar33._32_4_;
          auVar28._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar33._36_4_;
          auVar28._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar33._40_4_;
          auVar28._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar33._44_4_;
          auVar28._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar33._48_4_;
          auVar28._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar33._52_4_;
          auVar28._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar33._56_4_;
          auVar28._60_4_ = (uint)(bVar7 >> 7) * auVar33._60_4_;
          auVar33 = vpmaxud_avx512f(auVar27,auVar28);
          uVar19 = uVar19 + 0x10;
        } while (uVar18 != uVar19);
        auVar26 = vmovdqa32_avx512f(auVar33);
        auVar33._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar27._0_4_
        ;
        bVar2 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar33._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar27._4_4_;
        bVar2 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar33._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar27._8_4_;
        bVar2 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar33._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar27._12_4_;
        bVar2 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar33._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar27._16_4_;
        bVar2 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar33._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar27._20_4_;
        bVar2 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar33._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar27._24_4_;
        bVar2 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar33._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar27._28_4_;
        auVar33._32_4_ =
             (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar27._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar33._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar27._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar33._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar27._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar33._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar27._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar33._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar27._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar33._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar27._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar33._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar27._56_4_;
        auVar33._60_4_ =
             (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar27._60_4_;
        auVar23 = vextracti64x4_avx512f(auVar33,1);
        auVar26 = vpmaxud_avx512f(auVar33,ZEXT3264(auVar23));
        auVar22 = vpmaxud_avx(auVar26._0_16_,auVar26._16_16_);
        auVar4 = vpshufd_avx(auVar22,0xee);
        auVar22 = vpmaxud_avx(auVar22,auVar4);
        auVar4 = vpshufd_avx(auVar22,0x55);
        auVar22 = vpmaxud_avx(auVar22,auVar4);
        lVar12 = CONCAT44((int)(uVar18 >> 0x20),auVar22._0_4_);
      }
      else {
        lVar12 = 0;
      }
      uVar9 = uVar9 + 1;
      *(uint *)(auStack_134 + (ulong)(uint)(&__vseblocks_codeLogs)[lVar12] * 4 + -4) =
           *(int *)(auStack_134 + (ulong)(uint)(&__vseblocks_codeLogs)[lVar12] * 4 + -4) +
           (uVar14 - uVar17);
    } while (uVar9 != local_144);
  }
  auVar24._60_4_ = local_f8;
  auVar24._0_60_ = auStack_134;
  auVar24 = vmovdqu32_avx512f(auVar24);
  auVar25._0_60_ = auVar24._0_60_;
  auVar25._60_4_ = 0;
  uVar5 = vptestmd_avx512f(auVar25,auVar25);
  auVar24 = vpmovm2d_avx512dq(uVar5);
  auVar24 = vpsrld_avx512f(auVar24,0x1f);
  auVar24 = vpexpandd_avx512f(auVar24);
  auVar26._0_60_ = auVar24._0_60_;
  auVar26._60_4_ = 0;
  auVar22 = vpmovdb_avx512f(auVar26);
  auVar22 = vpsadbw_avx(auVar22,(undefined1  [16])0x0);
  auVar4 = vpshufd_avx(auVar22,0xee);
  auVar22 = vpaddq_avx(auVar22,auVar4);
  plVar11[2] = (ulong)auVar22._0_4_;
  *(undefined4 *)(plVar11 + 1) = 0x20;
  *plVar11 = (long)(out + 1);
  *out = auVar22._0_4_;
  *(undefined4 *)(plVar11 + 3) = 1;
  *(undefined4 *)(plVar11 + 1) = 0;
  lVar12 = 1;
  do {
    if (*(uint *)(auStack_134 + lVar12 * 4 + -4) != 0) {
      lVar16 = plVar11[2];
      uVar14 = *(uint *)(auStack_134 + lVar12 * 4 + -4) & 0xfffffff;
      uVar9 = lVar16 << 0x1c | (ulong)uVar14;
      plVar11[2] = uVar9;
      lVar8 = plVar11[1];
      uVar17 = (int)lVar8 + 0x1c;
      *(uint *)(plVar11 + 1) = uVar17;
      if (0x1f < uVar17) {
        puVar1 = (undefined4 *)*plVar11;
        *plVar11 = (long)(puVar1 + 1);
        *puVar1 = (int)(uVar9 >> ((ulong)(byte)((char)(int)lVar8 - 4) & 0x3f));
        *(int *)(plVar11 + 3) = (int)plVar11[3] + 1;
        *(int *)(plVar11 + 1) = (int)plVar11[1] + -0x20;
      }
      uVar9 = ((ulong)(uVar14 << 4) | lVar16 << 0x20) + lVar12;
      plVar11[2] = uVar9;
      lVar16 = plVar11[1];
      uVar17 = (int)lVar16 + 4;
      *(uint *)(plVar11 + 1) = uVar17;
      if (0x1f < uVar17) {
        puVar1 = (undefined4 *)*plVar11;
        *plVar11 = (long)(puVar1 + 1);
        *puVar1 = (int)(uVar9 >> ((ulong)(byte)((char)(int)lVar16 - 0x1c) & 0x3f));
        *(int *)(plVar11 + 3) = (int)plVar11[3] + 1;
        *(int *)(plVar11 + 1) = (int)plVar11[1] + -0x20;
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x10);
  local_b8[0] = 0;
  lVar12 = 1;
  do {
    if ((ulong)*(uint *)(auStack_134 + lVar12 * 4 + -4) == 0) {
      pvVar13 = (void *)0x0;
    }
    else {
      pvVar13 = operator_new__((ulong)*(uint *)(auStack_134 + lVar12 * 4 + -4) << 2);
    }
    local_b8[lVar12] = (long)pvVar13;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x10);
  if (local_144 != 0) {
    uVar9 = 0;
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      uVar17 = puVar10[uVar9];
      uVar18 = (ulong)uVar17;
      uVar14 = 0;
      if (uVar17 < puVar10[uVar9 + 1]) {
        auVar26 = vpbroadcastq_avx512f();
        auVar33 = ZEXT1664((undefined1  [16])0x0);
        uVar19 = 0;
        do {
          auVar27 = vmovdqa64_avx512f(auVar33);
          auVar33 = vpbroadcastq_avx512f();
          auVar28 = vporq_avx512f(auVar33,auVar24);
          auVar33 = vporq_avx512f(auVar33,auVar25);
          uVar5 = vpcmpuq_avx512f(auVar33,auVar26,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar28,auVar26,2);
          bVar7 = (byte)uVar5;
          uVar21 = CONCAT11(bVar7,bVar6);
          auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])(seq + uVar18 + uVar19));
          auVar29._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar33._4_4_;
          auVar29._0_4_ = (uint)(bVar6 & 1) * auVar33._0_4_;
          auVar29._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar33._8_4_;
          auVar29._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar33._12_4_;
          auVar29._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar33._16_4_;
          auVar29._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar33._20_4_;
          auVar29._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar33._24_4_;
          auVar29._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar33._28_4_;
          auVar29._32_4_ = (uint)(bVar7 & 1) * auVar33._32_4_;
          auVar29._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar33._36_4_;
          auVar29._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar33._40_4_;
          auVar29._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar33._44_4_;
          auVar29._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar33._48_4_;
          auVar29._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar33._52_4_;
          auVar29._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar33._56_4_;
          auVar29._60_4_ = (uint)(bVar7 >> 7) * auVar33._60_4_;
          auVar33 = vpmaxud_avx512f(auVar27,auVar29);
          uVar19 = uVar19 + 0x10;
        } while (((puVar10[uVar9 + 1] - uVar18) + 0xf & 0xfffffffffffffff0) != uVar19);
        auVar26 = vmovdqa32_avx512f(auVar33);
        auVar30._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar27._0_4_
        ;
        bVar2 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar30._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar27._4_4_;
        bVar2 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar30._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar27._8_4_;
        bVar2 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar30._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar27._12_4_;
        bVar2 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar30._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar27._16_4_;
        bVar2 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar30._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar27._20_4_;
        bVar2 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar30._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar27._24_4_;
        bVar2 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar30._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar27._28_4_;
        auVar30._32_4_ =
             (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar27._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar30._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar27._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar30._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar27._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar30._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar27._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar30._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar27._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar30._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar27._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar30._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar27._56_4_;
        auVar30._60_4_ =
             (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar27._60_4_;
        auVar23 = vextracti64x4_avx512f(auVar30,1);
        auVar26 = vpmaxud_avx512f(auVar30,ZEXT3264(auVar23));
        auVar22 = vpmaxud_avx(auVar26._0_16_,auVar26._16_16_);
        auVar4 = vpshufd_avx(auVar22,0xee);
        auVar22 = vpmaxud_avx(auVar22,auVar4);
        auVar4 = vpshufd_avx(auVar22,0x55);
        auVar22 = vpmaxud_avx(auVar22,auVar4);
        uVar14 = auVar22._0_4_;
      }
      uVar9 = uVar9 + 1;
      if ((uVar14 != 0) && (uVar17 < puVar10[uVar9])) {
        uVar19 = (ulong)(uint)(&__vseblocks_codeLogs)[uVar14];
        lVar12 = local_b8[uVar19];
        uVar17 = *(uint *)(auStack_f4 + uVar19 * 4 + -4);
        do {
          *(uint32_t *)(lVar12 + (ulong)uVar17 * 4) = in[uVar18];
          uVar17 = uVar17 + 1;
          uVar18 = uVar18 + 1;
        } while (uVar18 < puVar10[uVar9]);
        *(uint *)(auStack_f4 + uVar19 * 4 + -4) = uVar17;
      }
    } while (uVar9 < local_144);
  }
  lVar12 = 1;
  do {
    uVar17 = *(uint *)(auStack_134 + lVar12 * 4 + -4);
    if ((ulong)uVar17 != 0) {
      uVar14 = *(uint *)(__vseblocks_possLogs + lVar12 * 4);
      lVar16 = local_b8[lVar12];
      uVar9 = plVar11[2];
      uVar18 = 0;
      do {
        uVar9 = (ulong)(*(uint *)(lVar16 + uVar18 * 4) & ~(uint)(-1L << ((ulong)uVar14 & 0x3f))) |
                uVar9 << ((ulong)uVar14 & 0x3f);
        uVar15 = (int)plVar11[1] + uVar14;
        *(uint *)(plVar11 + 1) = uVar15;
        if (0x1f < uVar15) {
          puVar1 = (undefined4 *)*plVar11;
          *plVar11 = (long)(puVar1 + 1);
          *puVar1 = (int)(uVar9 >> ((ulong)(byte)((char)uVar15 - 0x20) & 0x3f));
          *(int *)(plVar11 + 3) = (int)plVar11[3] + 1;
          *(int *)(plVar11 + 1) = (int)plVar11[1] + -0x20;
        }
        uVar18 = uVar18 + 1;
      } while (uVar17 != uVar18);
      plVar11[2] = uVar9;
      uVar17 = *(uint *)(plVar11 + 1);
      if (uVar17 != 0) {
        if (0x20 < uVar17) {
          lVar16 = plVar11[2] << ((ulong)(byte)-(char)uVar17 & 0x3f);
          plVar11[2] = lVar16;
          puVar1 = (undefined4 *)*plVar11;
          *plVar11 = (long)(puVar1 + 1);
          *puVar1 = (int)((ulong)lVar16 >> 0x20);
          *plVar11 = (long)(puVar1 + 2);
          puVar1[1] = (int)lVar16;
          *(int *)(plVar11 + 3) = (int)plVar11[3] + 2;
          *(undefined4 *)(plVar11 + 1) = 0;
        }
        if ((int)plVar11[1] != 0) {
          puVar1 = (undefined4 *)*plVar11;
          *plVar11 = (long)(puVar1 + 1);
          *puVar1 = (int)(plVar11[2] << ((ulong)(uint)-((int)plVar11[1] + 0x20) & 0x3f));
          *(int *)(plVar11 + 3) = (int)plVar11[3] + 1;
        }
        plVar11[2] = 0;
        *(undefined4 *)(plVar11 + 1) = 0;
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x10);
  uVar17 = *(uint *)(plVar11 + 1);
  if (uVar17 != 0) {
    if (0x20 < uVar17) {
      lVar12 = plVar11[2] << ((ulong)(byte)-(char)uVar17 & 0x3f);
      plVar11[2] = lVar12;
      puVar1 = (undefined4 *)*plVar11;
      *plVar11 = (long)(puVar1 + 1);
      *puVar1 = (int)((ulong)lVar12 >> 0x20);
      *plVar11 = (long)(puVar1 + 2);
      puVar1[1] = (int)lVar12;
      *(int *)(plVar11 + 3) = (int)plVar11[3] + 2;
      *(undefined4 *)(plVar11 + 1) = 0;
    }
    if ((int)plVar11[1] != 0) {
      puVar1 = (undefined4 *)*plVar11;
      *plVar11 = (long)(puVar1 + 1);
      *puVar1 = (int)(plVar11[2] << ((ulong)(uint)-((int)plVar11[1] + 0x20) & 0x3f));
      *(int *)(plVar11 + 3) = (int)plVar11[3] + 1;
    }
    plVar11[2] = 0;
    *(undefined4 *)(plVar11 + 1) = 0;
  }
  if (local_144 != 0) {
    uVar9 = plVar11[2];
    uVar18 = 0;
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      uVar17 = puVar10[uVar18];
      uVar14 = puVar10[uVar18 + 1];
      uVar15 = 0;
      if (uVar17 < uVar14) {
        auVar26 = vpbroadcastq_avx512f();
        auVar33 = ZEXT1664((undefined1  [16])0x0);
        uVar19 = 0;
        do {
          auVar27 = vmovdqa64_avx512f(auVar33);
          auVar33 = vpbroadcastq_avx512f();
          auVar28 = vporq_avx512f(auVar33,auVar24);
          auVar33 = vporq_avx512f(auVar33,auVar25);
          uVar5 = vpcmpuq_avx512f(auVar33,auVar26,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar28,auVar26,2);
          bVar7 = (byte)uVar5;
          uVar21 = CONCAT11(bVar7,bVar6);
          auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])(seq + uVar17 + uVar19));
          auVar31._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar33._4_4_;
          auVar31._0_4_ = (uint)(bVar6 & 1) * auVar33._0_4_;
          auVar31._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar33._8_4_;
          auVar31._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar33._12_4_;
          auVar31._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar33._16_4_;
          auVar31._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar33._20_4_;
          auVar31._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar33._24_4_;
          auVar31._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar33._28_4_;
          auVar31._32_4_ = (uint)(bVar7 & 1) * auVar33._32_4_;
          auVar31._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar33._36_4_;
          auVar31._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar33._40_4_;
          auVar31._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar33._44_4_;
          auVar31._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar33._48_4_;
          auVar31._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar33._52_4_;
          auVar31._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar33._56_4_;
          auVar31._60_4_ = (uint)(bVar7 >> 7) * auVar33._60_4_;
          auVar33 = vpmaxud_avx512f(auVar27,auVar31);
          uVar19 = uVar19 + 0x10;
        } while ((((ulong)uVar14 - (ulong)uVar17) + 0xf & 0xfffffffffffffff0) != uVar19);
        auVar26 = vmovdqa32_avx512f(auVar33);
        auVar32._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar27._0_4_
        ;
        bVar2 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar32._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar27._4_4_;
        bVar2 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar32._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar27._8_4_;
        bVar2 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar32._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar27._12_4_;
        bVar2 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar32._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar27._16_4_;
        bVar2 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar32._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar27._20_4_;
        bVar2 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar32._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar27._24_4_;
        bVar2 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar32._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar27._28_4_;
        auVar32._32_4_ =
             (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar27._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar32._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar27._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar32._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar27._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar32._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar27._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar32._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar27._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar32._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar27._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar32._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar27._56_4_;
        auVar32._60_4_ =
             (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar27._60_4_;
        auVar23 = vextracti64x4_avx512f(auVar32,1);
        auVar26 = vpmaxud_avx512f(auVar32,ZEXT3264(auVar23));
        auVar22 = vpmaxud_avx(auVar26._0_16_,auVar26._16_16_);
        auVar4 = vpshufd_avx(auVar22,0xee);
        auVar22 = vpmaxud_avx(auVar22,auVar4);
        auVar4 = vpshufd_avx(auVar22,0x55);
        auVar22 = vpmaxud_avx(auVar22,auVar4);
        uVar15 = auVar22._0_4_;
      }
      if (uVar15 == 0) {
        piVar20 = &__vseblocks_posszLens;
        lVar12 = 0;
        do {
          if (uVar14 - uVar17 == *piVar20) goto LAB_0010def3;
          lVar12 = lVar12 + 1;
          piVar20 = piVar20 + 1;
        } while (lVar12 != 0x10);
      }
      else {
        piVar20 = &__vseblocks_possLens;
        lVar12 = 0;
        do {
          if (uVar14 - uVar17 == *piVar20) goto LAB_0010def3;
          lVar12 = lVar12 + 1;
          piVar20 = piVar20 + 1;
        } while (lVar12 != 0x10);
      }
      lVar12 = 0;
LAB_0010def3:
      uVar9 = (ulong)((&__vseblocks_codeLogs)[uVar15] & 0xf) | uVar9 << 4;
      lVar16 = plVar11[1];
      uVar17 = (int)lVar16 + 4;
      *(uint *)(plVar11 + 1) = uVar17;
      if (0x1f < uVar17) {
        puVar1 = (undefined4 *)*plVar11;
        *plVar11 = (long)(puVar1 + 1);
        *puVar1 = (int)(uVar9 >> ((ulong)(byte)((char)(int)lVar16 - 0x1c) & 0x3f));
        *(int *)(plVar11 + 3) = (int)plVar11[3] + 1;
        *(int *)(plVar11 + 1) = (int)plVar11[1] + -0x20;
      }
      uVar9 = (ulong)((uint)lVar12 & 0xf) | uVar9 << 4;
      lVar12 = plVar11[1];
      uVar17 = (int)lVar12 + 4;
      *(uint *)(plVar11 + 1) = uVar17;
      if (0x1f < uVar17) {
        puVar1 = (undefined4 *)*plVar11;
        *plVar11 = (long)(puVar1 + 1);
        *puVar1 = (int)(uVar9 >> ((ulong)(byte)((char)(int)lVar12 - 0x1c) & 0x3f));
        *(int *)(plVar11 + 3) = (int)plVar11[3] + 1;
        *(int *)(plVar11 + 1) = (int)plVar11[1] + -0x20;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < local_144);
    plVar11[2] = uVar9;
  }
  uVar17 = *(uint *)(plVar11 + 1);
  if (uVar17 != 0) {
    if (0x20 < uVar17) {
      lVar12 = plVar11[2] << ((ulong)(byte)-(char)uVar17 & 0x3f);
      plVar11[2] = lVar12;
      puVar1 = (undefined4 *)*plVar11;
      *plVar11 = (long)(puVar1 + 1);
      *puVar1 = (int)((ulong)lVar12 >> 0x20);
      *plVar11 = (long)(puVar1 + 2);
      puVar1[1] = (int)lVar12;
      *(int *)(plVar11 + 3) = (int)plVar11[3] + 2;
      *(undefined4 *)(plVar11 + 1) = 0;
    }
    if ((int)plVar11[1] != 0) {
      puVar1 = (undefined4 *)*plVar11;
      *plVar11 = (long)(puVar1 + 1);
      *puVar1 = (int)(plVar11[2] << ((ulong)(uint)-((int)plVar11[1] + 0x20) & 0x3f));
      *(int *)(plVar11 + 3) = (int)plVar11[3] + 1;
    }
    plVar11[2] = 0;
    *(undefined4 *)(plVar11 + 1) = 0;
  }
  lVar12 = 0;
  do {
    if ((void *)local_b8[lVar12] != (void *)0x0) {
      operator_delete__((void *)local_b8[lVar12]);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x10);
  if (puVar10 != (uint32_t *)0x0) {
    operator_delete__(puVar10);
  }
  operator_delete__(seq);
  *local_140 = *(uint32_t *)(plVar11 + 3);
  operator_delete(plVar11);
  return;
}

Assistant:

inline void VSEncodingBlocks::encodeVS(uint32_t len, const uint32_t *in,
                                uint32_t &size, uint32_t *out) {
  uint32_t i;
  uint32_t j;
  uint32_t *logs;
  uint32_t numBlocks;
  uint32_t maxB;
  uint32_t ntotal;
  uint32_t *part;
  uint32_t *blocks[VSEBLOCKS_LOGS_LEN];
  uint32_t blockCur[VSEBLOCKS_LOGS_LEN];
  uint32_t countBlocksLogs[VSEBLOCKS_LOGS_LEN];
  BitsWriter *wt;

  logs = new uint32_t[len];

  if (logs == NULL)
    fprintf(stderr, "Can't allocate memory\n");

  /* Compute logs of all numbers */
  for (i = 0; i < len; i++)
    logs[i] = __vseblocks_remapLogs[1 + asmbits(in[i])];

  /* Compute optimal partition */
  part = __vseblocks->compute_OptPartition(
      logs, len, VSEBLOCKS_LOGLEN + VSEBLOCKS_LOGLOG, numBlocks);

  /* Ready to write */
  wt = new BitsWriter(out);

  if (wt == NULL)
    fprintf(stderr, "Can't initialize a class\n");

  /* countBlocksLogs[i] says how many blocks uses i bits */
  for (i = 0; i < VSEBLOCKS_LOGS_LEN; i++) {
    countBlocksLogs[i] = 0;
    blockCur[i] = 0;
  }

  /* Count number of occs of each log */
  for (i = 0; i < numBlocks; i++) {
    /* Compute max B in the block */
    for (maxB = 0, j = part[i]; j < part[i + 1]; j++)
      if (maxB < logs[j])
        maxB = logs[j];

    countBlocksLogs[__vseblocks_codeLogs[maxB]] += part[i + 1] - part[i];
  }

  for (ntotal = 0, i = 1; i < VSEBLOCKS_LOGS_LEN; i++)
    if (countBlocksLogs[i] > 0)
      ntotal++;

  /* Write occs. zero is assumed to be present */
  wt->bit_writer(ntotal, 32);

  /* For each logs write it and the number of its occurrences */
  for (i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    if (countBlocksLogs[i] > 0) {
      wt->bit_writer(countBlocksLogs[i], 28);
      wt->bit_writer(i, 4);
    }
  }

  /* Prepare arrays to store groups of elements */
  for (blocks[0] = 0, i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    if (countBlocksLogs[i] > 0) {
      blocks[i] = new uint32_t[countBlocksLogs[i]];

      if (blocks[i] == NULL)
        fprintf(stderr, "Can't allocate memory\n");
    } else {
      blocks[i] = NULL;
    }
  }

  /* Permute the elements based on their values of B */
  for (i = 0; i < numBlocks; i++) {
    for (maxB = 0, j = part[i]; j < part[i + 1]; j++)
      if (maxB < logs[j])
        maxB = logs[j];

    if (!maxB)
      continue;

    for (j = part[i]; j < part[i + 1]; j++) {
      /* Save current element in its bucket */
      blocks[__vseblocks_codeLogs[maxB]][blockCur[__vseblocks_codeLogs[maxB]]] =
          in[j];
      blockCur[__vseblocks_codeLogs[maxB]]++;
    }
  }

  /* Write each bucket ... keeping byte alligment */
  for (i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    for (j = 0; j < countBlocksLogs[i]; j++)
      wt->bit_writer(blocks[i][j], __vseblocks_possLogs[i]);

    /* Align to next word */
    if (countBlocksLogs[i] > 0)
      wt->bit_flush();
  }

  wt->bit_flush();

  /* write block codes... a byte each */
  for (i = 0; i < numBlocks; i++) {
    /* Compute max B in the block */
    for (j = part[i], maxB = 0; j < part[i + 1]; j++) {
      if (maxB < logs[j])
        maxB = logs[j];
    }

    if (maxB) {
      /* Compute the code for the block length */
      for (j = 0; j < VSEBLOCKS_LENS_LEN; j++) {
        if (part[i + 1] - part[i] == __vseblocks_possLens[j])
          break;
      }
    } else {
      /*
       * Treat runs of 0 in a different way.
       * Compute the code for the block length.
       */
      for (j = 0; j < VSEBLOCKS_LENS_LEN; j++) {
        if (part[i + 1] - part[i] == __vseblocks_posszLens[j])
          break;
      }
    }

    /* Writes the value of B and K */
    wt->bit_writer(__vseblocks_codeLogs[maxB], VSEBLOCKS_LOGLOG);
    wt->bit_writer(j, VSEBLOCKS_LOGLEN);
  }

  /* Align to 32-bit */
  wt->bit_flush();

  /* Finalization */
  for (i = 0; i < VSEBLOCKS_LOGS_LEN; i++)
    delete[] blocks[i];

  delete[] part;
  delete[] logs;

  size = wt->written;

  delete wt;
}